

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O2

void __thiscall efsw::DirectorySnapshot::updateFile(DirectorySnapshot *this,string *path)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)path);
  addFile(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void DirectorySnapshot::updateFile( std::string path ) {
	addFile( path );
}